

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_tzparse.c
# Opt level: O0

_Bool increment_overflow_time(time_t *tp,int_fast32_t j)

{
  int_fast32_t j_local;
  time_t *tp_local;
  
  if (j < 0) {
    if (-0x8000000000000000 - (long)j <= *tp) {
LAB_0010627d:
      *tp = (long)j + *tp;
      return false;
    }
  }
  else if (*tp <= 0x7fffffffffffffff - (long)j) goto LAB_0010627d;
  return true;
}

Assistant:

static bool increment_overflow_time( time_t * tp, int_fast32_t j )
{
    /* This is like
       'if (! (_PDCLIB_TIME_MIN <= *tp + j && *tp + j <= _PDCLIB_TIME_MAX)) ...',
       except that it does the right thing even if *tp + j would overflow.
    */
    if ( ! ( j < 0
           ? ( _PDCLIB_TYPE_SIGNED( time_t ) ? _PDCLIB_TIME_MIN - j <= *tp : -1 - j < *tp )
           : *tp <= _PDCLIB_TIME_MAX - j ) )
    {
        return true;
    }

    *tp += j;
    return false;
}